

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::Module::GetTypes
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,Module *this)

{
  Instruction *pIVar1;
  bool bVar2;
  Instruction *in_RAX;
  Instruction *inst;
  Instruction *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar1 = &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_28 = in_RAX;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
  {
    bVar2 = IsTypeInst(pIVar1->opcode_);
    if (bVar2) {
      local_28 = pIVar1;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 __return_storage_ptr__,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> Module::GetTypes() {
  std::vector<Instruction*> type_insts;
  for (auto& inst : types_values_) {
    if (IsTypeInst(inst.opcode())) type_insts.push_back(&inst);
  }
  return type_insts;
}